

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TtfUtil.cpp
# Opt level: O0

gid16 TtfUtil::Cmap310Lookup(void *pCmap310,uint uUnicodeId)

{
  uint32 uVar1;
  uint32 uVar2;
  uint32 uVar3;
  uint in_ESI;
  uint32 uStartGid;
  uint32 uDiff;
  uint32 uEndCode;
  uint32 uStartCode;
  uint i;
  uint32 ucGroups;
  CmapSubTableFormat12 *pTable;
  uint local_28;
  
  uVar1 = read<unsigned_int>(0);
  local_28 = 0;
  while( true ) {
    if (uVar1 <= local_28) {
      return 0;
    }
    uVar2 = read<unsigned_int>(0);
    uVar3 = read<unsigned_int>(0);
    if ((uVar2 <= in_ESI) && (in_ESI <= uVar3)) break;
    local_28 = local_28 + 1;
  }
  uVar1 = read<unsigned_int>(0);
  return (short)uVar1 + ((short)in_ESI - (short)uVar2);
}

Assistant:

gr::gid16 Cmap310Lookup(const void * pCmap310, unsigned int uUnicodeId)
{
	const Sfnt::CmapSubTableFormat12 * pTable = reinterpret_cast<const Sfnt::CmapSubTableFormat12 *>(pCmap310);

	//uint32 uLength = read(pTable->length); //could use to test for premature end of table
	uint32 ucGroups = read(pTable->num_groups);

	for (unsigned int i = 0; i < ucGroups; i++)
	{
		uint32 uStartCode = read(pTable->group[i].start_char_code);
		uint32 uEndCode = read(pTable->group[i].end_char_code);
		if (uUnicodeId >= uStartCode && uUnicodeId <= uEndCode)
		{
			uint32 uDiff = uUnicodeId - uStartCode;
			uint32 uStartGid = read(pTable->group[i].start_glyph_id);
			return static_cast<gr::gid16>(uStartGid + uDiff);
		}
	}

	return 0;
}